

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

void anurbs::Model::register_python_data_type<anurbs::BrepFace>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *pcVar1;
  unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>>>
  *this;
  arg aVar2;
  char *local_1c0;
  undefined1 local_1b8;
  arg local_1b0;
  arg local_1a0;
  arg local_190;
  _func_Ref<anurbs::BrepFace>_Model_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_shared_ptr<anurbs::BrepFace>
  *local_180;
  arg local_178;
  arg local_168;
  arg local_158;
  arg local_148;
  _func_Ref<anurbs::BrepFace>_Model_ptr_unsigned_long_shared_ptr<anurbs::BrepFace> *local_138;
  arg local_130;
  arg local_120;
  type local_109;
  arg local_108;
  arg local_f8;
  arg local_e8;
  arg local_d8;
  _func_Ref<anurbs::BrepFace>_Model_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_shared_ptr<anurbs::BrepFace>
  *local_c8;
  arg local_c0;
  arg local_b0;
  arg local_a0;
  arg local_90;
  _func_Ref<anurbs::BrepFace>_Model_ptr_shared_ptr<anurbs::BrepFace>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_80;
  arg local_78;
  arg local_68;
  _func_Ref<anurbs::BrepFace>_Model_ptr_shared_ptr<anurbs::BrepFace> *local_58 [3];
  key_type local_40;
  unique_ptr<anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>,_std::default_delete<anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>_>_>
  local_20;
  class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *local_18;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  local_18 = (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *)model;
  model_local = (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)m;
  register_type<anurbs::BrepFace>(false);
  Ref<anurbs::BrepFace>::register_python((module *)model_local);
  new_<anurbs::PythonDataType<anurbs::Model,anurbs::BrepFace>>();
  BrepFace::type_name_abi_cxx11_();
  this = (unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>>>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,_std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>_>_>_>_>_>
            ::operator[](&PythonDataTypeBase<anurbs::Model>::s_types_abi_cxx11_,&local_40);
  std::
  unique_ptr<anurbs::PythonDataTypeBase<anurbs::Model>,std::default_delete<anurbs::PythonDataTypeBase<anurbs::Model>>>
  ::operator=(this,&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  unique_ptr<anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>,_std::default_delete<anurbs::PythonDataType<anurbs::Model,_anurbs::BrepFace>_>_>
  ::~unique_ptr(&local_20);
  pcVar1 = local_18;
  local_58[0] = PythonDataType<anurbs::Model,_anurbs::BrepFace>::add;
  local_78 = pybind11::literals::operator____a("data",4);
  local_68._8_1_ = local_78._8_1_;
  local_68.name = local_78.name;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepFace>(*)(anurbs::Model&,std::shared_ptr<anurbs::BrepFace>),pybind11::arg>
            (pcVar1,"add",local_58,&local_68);
  pcVar1 = local_18;
  local_80 = PythonDataType<anurbs::Model,_anurbs::BrepFace>::add_with_attributes;
  local_a0 = pybind11::literals::operator____a("data",4);
  local_90._8_1_ = local_a0._8_1_;
  local_90.name = local_a0.name;
  local_c0 = pybind11::literals::operator____a("attributes",10);
  local_b0._8_1_ = local_c0._8_1_;
  local_b0.name = local_c0.name;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepFace>(*)(anurbs::Model&,std::shared_ptr<anurbs::BrepFace>,std::__cxx11::string_const&),pybind11::arg,pybind11::arg>
            (pcVar1,"add",&local_80,&local_90,&local_b0);
  pcVar1 = local_18;
  local_c8 = PythonDataType<anurbs::Model,_anurbs::BrepFace>::add_with_key;
  local_e8 = pybind11::literals::operator____a("key",3);
  local_d8._8_1_ = local_e8._8_1_;
  local_d8.name = local_e8.name;
  local_108 = pybind11::literals::operator____a("data",4);
  local_f8._8_1_ = local_108._8_1_;
  local_f8.name = local_108.name;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepFace>(*)(anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::BrepFace>),pybind11::arg,pybind11::arg>
            (pcVar1,"add",&local_c8,&local_d8,&local_f8);
  pcVar1 = local_18;
  local_130 = pybind11::literals::operator____a("ref",3);
  local_120._8_1_ = local_130._8_1_;
  local_120.name = local_130.name;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Model::register_python_data_type<anurbs::BrepFace>(pybind11::module&,pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>&)::_lambda(anurbs::Model&,anurbs::Ref<anurbs::BrepFace>const&)_1_,pybind11::arg>
            (pcVar1,"add",&local_109,&local_120);
  pcVar1 = local_18;
  local_138 = PythonDataType<anurbs::Model,_anurbs::BrepFace>::replace;
  local_158 = pybind11::literals::operator____a("index",5);
  local_148._8_1_ = local_158._8_1_;
  local_148.name = local_158.name;
  local_178 = pybind11::literals::operator____a("data",4);
  local_168._8_1_ = local_178._8_1_;
  local_168.name = local_178.name;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepFace>(*)(anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::BrepFace>),pybind11::arg,pybind11::arg>
            (pcVar1,"replace",&local_138,&local_148,&local_168);
  pcVar1 = local_18;
  local_180 = PythonDataType<anurbs::Model,_anurbs::BrepFace>::replace_with_key;
  local_1a0 = pybind11::literals::operator____a("key",3);
  local_190._8_1_ = local_1a0._8_1_;
  local_190.name = local_1a0.name;
  aVar2 = pybind11::literals::operator____a("data",4);
  local_1c0 = aVar2.name;
  local_1b0.name = local_1c0;
  local_1b8 = aVar2._8_1_;
  local_1b0._8_1_ = local_1b8;
  pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
  def<anurbs::Ref<anurbs::BrepFace>(*)(anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::BrepFace>),pybind11::arg,pybind11::arg>
            (pcVar1,"replace",&local_180,&local_190,&local_1b0);
  return;
}

Assistant:

static void register_python_data_type(pybind11::module& m,
        pybind11::class_<Model, Pointer<Model>>& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        Model::register_type<TData>();

        Ref<TData>::register_python(m);

        PythonDataTypeBase<Model>::s_types[TData::type_name()] =
            new_<PythonDataType<Model, TData>>();

        model.def("add", &PythonDataType<Model, TData>::add, "data"_a);

        model.def("add", &PythonDataType<Model, TData>::add_with_attributes,
            "data"_a, "attributes"_a);

        model.def("add", &PythonDataType<Model, TData>::add_with_key, "key"_a,
            "data"_a);

        model.def("add", [](anurbs::Model& self, const Ref<TData>& ref) {
            return PythonDataType<Model, TData>::add_with_key(self, ref.key(),
            ref.data()); }, "ref"_a);
        
        model.def("replace", &PythonDataType<Model, TData>::replace, "index"_a,
            "data"_a);

        model.def("replace", &PythonDataType<Model, TData>::replace_with_key,
            "key"_a, "data"_a);
    }